

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.cpp
# Opt level: O2

string * __thiscall
vkt::sparse::getImageComponentVec4TypeName_abi_cxx11_
          (string *__return_storage_ptr__,sparse *this,TextureFormat *format)

{
  TextureChannelClass TVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    __s = "%type_ivec4";
    __a = &local_a;
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    __s = "%type_uvec4";
    __a = &local_9;
  }
  else {
    __s = "";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getImageComponentVec4TypeName (const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return "%type_uvec4";
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return "%type_ivec4";
		default:
			DE_ASSERT(0);
			return "";
	}
}